

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp_math.c
# Opt level: O3

int s_mp_exptmod(mp_int *G,mp_int *X,mp_int *P,mp_int *Y,int redmode)

{
  mp_int *c;
  ulong uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  int iVar4;
  mp_digit *pmVar5;
  code *pcVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  mp_digit **ppmVar11;
  mp_int *pmVar12;
  ulong uVar13;
  uint uVar14;
  long lVar15;
  mp_digit mVar16;
  int iVar17;
  mp_int mu;
  mp_int t;
  int local_18c8;
  mp_int local_18a8;
  mp_int *local_1890;
  mp_int local_1888;
  mp_int *local_1870;
  mp_int *local_1868;
  ulong local_1860;
  undefined8 local_1858;
  undefined8 uStack_1850;
  mp_digit *local_1848;
  mp_int mStack_1838;
  mp_int local_1820 [255];
  
  iVar8 = X->used;
  uVar13 = 2;
  if ((long)iVar8 != 0) {
    uVar7 = (iVar8 + -1) * 0x3c;
    uVar1 = X->dp[(long)iVar8 + -1];
    lVar15 = 0x3f;
    if (uVar1 != 0) {
      for (; uVar1 >> lVar15 == 0; lVar15 = lVar15 + -1) {
      }
    }
    uVar9 = (uVar7 + 0x40) - ((uint)lVar15 ^ 0x3f);
    if (uVar1 == 0) {
      uVar9 = uVar7;
    }
    if ((((7 < (int)uVar9) && (uVar13 = 3, 0x24 < uVar9)) && (uVar13 = 4, 0x8c < uVar9)) &&
       ((uVar13 = 5, 0x1c2 < uVar9 && (uVar13 = 6, 0x517 < uVar9)))) {
      uVar13 = (ulong)(8 - (uVar9 < 0xdca));
    }
  }
  local_1820[0].dp = (mp_digit *)calloc(1,0x100);
  if (local_1820[0].dp == (mp_digit *)0x0) {
    return -2;
  }
  local_1820[0].used = 0;
  local_1820[0].alloc = 0x20;
  local_1820[0].sign = 0;
  iVar8 = (int)uVar13 + -1;
  uVar7 = 1 << ((byte)iVar8 & 0x1f);
  uVar9 = 1 << ((byte)uVar13 & 0x1f);
  local_1890 = G;
  local_1870 = X;
  local_1868 = Y;
  local_1860 = uVar13;
  if (uVar7 < uVar9) {
    uVar13 = (ulong)uVar7;
    ppmVar11 = &local_1820[uVar13 - 1].dp;
    lVar15 = 0;
    do {
      pmVar5 = (mp_digit *)calloc(1,0x100);
      *ppmVar11 = pmVar5;
      if (pmVar5 == (mp_digit *)0x0) {
        if (uVar7 < uVar7 - (int)lVar15) {
          lVar15 = -lVar15;
          ppmVar11 = &local_1820[uVar13 - 1].dp;
          do {
            if (*ppmVar11 != (mp_digit *)0x0) {
              free(*ppmVar11);
              *ppmVar11 = (mp_digit *)0x0;
              ((mp_int *)(ppmVar11 + -2))->used = 0;
              ((mp_int *)(ppmVar11 + -2))->alloc = 0;
              *(int *)(ppmVar11 + -1) = 0;
            }
            ppmVar11 = ppmVar11 + 3;
            lVar15 = lVar15 + -1;
          } while (lVar15 != 0);
        }
        if (local_1820[0].dp == (mp_digit *)0x0) {
          return -2;
        }
        free(local_1820[0].dp);
        return -2;
      }
      ((mp_int *)(ppmVar11 + -2))->used = 0;
      ((mp_int *)(ppmVar11 + -2))->alloc = 0x20;
      *(int *)(ppmVar11 + -1) = 0;
      lVar15 = lVar15 + -1;
      ppmVar11 = ppmVar11 + 3;
    } while (uVar13 - uVar9 != lVar15);
  }
  local_1888.dp = (mp_digit *)calloc(1,0x100);
  if (local_1888.dp == (mp_digit *)0x0) {
    iVar4 = -2;
    goto LAB_00107857;
  }
  local_1888.used = 0;
  local_1888.alloc = 0x20;
  local_1888.sign = 0;
  if (redmode == 0) {
    iVar4 = mp_reduce_setup(&local_1888,P);
    if (iVar4 == 0) {
      pcVar6 = mp_reduce;
      goto LAB_001077ec;
    }
  }
  else {
    iVar4 = mp_reduce_2k_setup_l(P,&local_1888);
    if (iVar4 == 0) {
      pcVar6 = mp_reduce_2k_l;
LAB_001077ec:
      iVar4 = mp_mod(local_1890,P,local_1820);
      if (iVar4 == 0) {
        uVar13 = (ulong)uVar7;
        pmVar12 = &mStack_1838 + uVar13;
        iVar4 = mp_copy(local_1820,pmVar12);
        if (iVar4 == 0) {
          iVar17 = 1;
          if (1 < iVar8) {
            iVar17 = iVar8;
          }
          do {
            iVar4 = s_mp_sqr(pmVar12,pmVar12);
            local_1820[uVar13 - 1].sign = 0;
            if ((iVar4 != 0) || (iVar4 = (*pcVar6)(pmVar12,P,&local_1888), iVar4 != 0))
            goto LAB_00107834;
            iVar17 = iVar17 + -1;
          } while (iVar17 != 0);
          do {
            uVar13 = uVar13 + 1;
            if (uVar9 <= uVar13) {
              local_18a8.dp = (mp_digit *)calloc(1,0x100);
              if (local_18a8.dp != (mp_digit *)0x0) {
                local_18a8.alloc = 0x20;
                local_18a8.sign = 0;
                *local_18a8.dp = 1;
                local_18a8.used = 1;
                local_1890 = (mp_int *)CONCAT44(local_1890._4_4_,local_1870->used + -1);
                iVar17 = 1;
                mVar16 = 0;
                uVar14 = 0;
                local_18c8 = 0;
                iVar8 = 0;
                goto LAB_001079dd;
              }
              iVar4 = -2;
              break;
            }
            c = pmVar12 + 1;
            iVar4 = mp_mul(pmVar12,local_1820,c);
            if (iVar4 != 0) break;
            pmVar12 = pmVar12 + 1;
            iVar4 = (*pcVar6)(c,P,&local_1888);
          } while (iVar4 == 0);
        }
      }
    }
  }
  goto LAB_00107834;
  while( true ) {
    iVar4 = (*pcVar6)(&local_18a8,P,&local_1888);
    iVar8 = 1;
    uVar14 = 0;
    local_18c8 = 0;
    if (iVar4 != 0) break;
LAB_001079dd:
    do {
      pmVar12 = local_1870;
      while( true ) {
        do {
          iVar4 = iVar8;
          iVar17 = iVar17 + -1;
          if (iVar17 == 0) {
            if ((int)local_1890 == -1) {
              if (local_18c8 < 1 || iVar4 != 2) goto LAB_00107bda;
              goto LAB_00107b78;
            }
            lVar15 = (long)(int)local_1890;
            local_1890 = (mp_int *)CONCAT44(local_1890._4_4_,(int)local_1890 + -1);
            mVar16 = pmVar12->dp[lVar15];
            iVar17 = 0x3c;
          }
          uVar10 = (uint)(mVar16 >> 0x3b) & 1;
          mVar16 = mVar16 * 2;
          iVar8 = 0;
        } while (iVar4 == 0 && uVar10 == 0);
        if ((iVar4 != 1) || (uVar10 != 0)) break;
        iVar4 = s_mp_sqr(&local_18a8,&local_18a8);
        local_18a8.sign = 0;
        if (iVar4 != 0) goto LAB_00107c1c;
        iVar4 = (*pcVar6)(&local_18a8,P,&local_1888);
        iVar8 = 1;
        if (iVar4 != 0) goto LAB_00107c1c;
      }
      local_18c8 = local_18c8 + 1;
      uVar14 = uVar14 | uVar10 << ((char)local_1860 - (char)local_18c8 & 0x1fU);
      iVar8 = 2;
      uVar13 = local_1860 & 0xffffffff;
    } while ((int)local_1860 != local_18c8);
    do {
      iVar4 = s_mp_sqr(&local_18a8,&local_18a8);
      local_18a8.sign = 0;
      if ((iVar4 != 0) || (iVar4 = (*pcVar6)(&local_18a8,P,&local_1888), iVar4 != 0))
      goto LAB_00107c1c;
      uVar10 = (int)uVar13 - 1;
      uVar13 = (ulong)uVar10;
    } while (uVar10 != 0);
    iVar4 = mp_mul(&local_18a8,&mStack_1838 + (int)uVar14,&local_18a8);
    if (iVar4 != 0) break;
  }
  goto LAB_00107c1c;
  while (local_18c8 = local_18c8 + -1, local_18c8 != 0) {
LAB_00107b78:
    iVar4 = s_mp_sqr(&local_18a8,&local_18a8);
    local_18a8.sign = 0;
    if (((iVar4 != 0) || (iVar4 = (*pcVar6)(&local_18a8,P,&local_1888), iVar4 != 0)) ||
       ((uVar14 = uVar14 * 2, (uVar14 & uVar9) != 0 &&
        ((iVar4 = mp_mul(&local_18a8,local_1820,&local_18a8), iVar4 != 0 ||
         (iVar4 = (*pcVar6)(&local_18a8,P,&local_1888), iVar4 != 0)))))) goto LAB_00107c1c;
  }
LAB_00107bda:
  local_1848 = local_18a8.dp;
  local_1858 = CONCAT44(local_18a8.alloc,local_18a8.used);
  uStack_1850 = CONCAT44(local_18a8._12_4_,local_18a8.sign);
  pmVar5 = local_1868->dp;
  uVar2 = local_1868->used;
  uVar3 = local_1868->alloc;
  local_18a8.sign = (int)*(undefined8 *)&local_1868->sign;
  local_18a8._12_4_ = SUB84((ulong)*(undefined8 *)&local_1868->sign >> 0x20,0);
  local_1868->used = local_18a8.used;
  local_1868->alloc = local_18a8.alloc;
  *(undefined8 *)&local_1868->sign = uStack_1850;
  local_1868->dp = local_18a8.dp;
  iVar4 = 0;
  local_18a8.used = uVar2;
  local_18a8.alloc = uVar3;
  local_18a8.dp = pmVar5;
LAB_00107c1c:
  if (local_18a8.dp != (mp_digit *)0x0) {
    free(local_18a8.dp);
    local_18a8.dp = (mp_digit *)0x0;
    local_18a8.used = 0;
    local_18a8.alloc = 0;
    local_18a8.sign = 0;
  }
LAB_00107834:
  if (local_1888.dp != (mp_digit *)0x0) {
    free(local_1888.dp);
    local_1888.dp = (mp_digit *)0x0;
    local_1888.used = 0;
    local_1888.alloc = 0;
    local_1888.sign = 0;
  }
LAB_00107857:
  if (local_1820[0].dp != (mp_digit *)0x0) {
    free(local_1820[0].dp);
    local_1820[0].dp = (mp_digit *)0x0;
    local_1820[0].used = 0;
    local_1820[0].alloc = 0;
    local_1820[0].sign = 0;
  }
  if (uVar7 < uVar9) {
    ppmVar11 = &local_1820[(ulong)uVar7 - 1].dp;
    lVar15 = (ulong)uVar9 - (ulong)uVar7;
    do {
      if (*ppmVar11 != (mp_digit *)0x0) {
        free(*ppmVar11);
        *ppmVar11 = (mp_digit *)0x0;
        ((mp_int *)(ppmVar11 + -2))->used = 0;
        ((mp_int *)(ppmVar11 + -2))->alloc = 0;
        *(int *)(ppmVar11 + -1) = 0;
      }
      ppmVar11 = ppmVar11 + 3;
      lVar15 = lVar15 + -1;
    } while (lVar15 != 0);
  }
  return iVar4;
}

Assistant:

int s_mp_exptmod (mp_int * G, mp_int * X, mp_int * P, mp_int * Y, int redmode)
{
  mp_int  M[TAB_SIZE], res, mu;
  mp_digit buf;
  int     err, bitbuf, bitcpy, bitcnt, mode, digidx, x, y, winsize;
  int (*redux)(mp_int*,mp_int*,mp_int*);

  /* find window size */
  x = mp_count_bits (X);
  if (x <= 7) {
    winsize = 2;
  } else if (x <= 36) {
    winsize = 3;
  } else if (x <= 140) {
    winsize = 4;
  } else if (x <= 450) {
    winsize = 5;
  } else if (x <= 1303) {
    winsize = 6;
  } else if (x <= 3529) {
    winsize = 7;
  } else {
    winsize = 8;
  }

  /* init M array */
  /* init first cell */
  if ((err = mp_init(&M[1])) != MP_OKAY) {
     return err; 
  }

  /* now init the second half of the array */
  for (x = 1<<(winsize-1); x < (1 << winsize); x++) {
    if ((err = mp_init(&M[x])) != MP_OKAY) {
      for (y = 1<<(winsize-1); y < x; y++) {
        mp_clear (&M[y]);
      }
      mp_clear(&M[1]);
      return err;
    }
  }

  /* create mu, used for Barrett reduction */
  if ((err = mp_init (&mu)) != MP_OKAY) {
    goto LBL_M;
  }
  
  if (redmode == 0) {
     if ((err = mp_reduce_setup (&mu, P)) != MP_OKAY) {
        goto LBL_MU;
     }
     redux = mp_reduce;
  } else {
     if ((err = mp_reduce_2k_setup_l (P, &mu)) != MP_OKAY) {
        goto LBL_MU;
     }
     redux = mp_reduce_2k_l;
  }    

  /* create M table
   *
   * The M table contains powers of the base, 
   * e.g. M[x] = G**x mod P
   *
   * The first half of the table is not 
   * computed though accept for M[0] and M[1]
   */
  if ((err = mp_mod (G, P, &M[1])) != MP_OKAY) {
    goto LBL_MU;
  }

  /* compute the value at M[1<<(winsize-1)] by squaring 
   * M[1] (winsize-1) times 
   */
  if ((err = mp_copy (&M[1], &M[1 << (winsize - 1)])) != MP_OKAY) {
    goto LBL_MU;
  }

  for (x = 0; x < (winsize - 1); x++) {
    /* square it */
    if ((err = mp_sqr (&M[1 << (winsize - 1)], 
                       &M[1 << (winsize - 1)])) != MP_OKAY) {
      goto LBL_MU;
    }

    /* reduce modulo P */
    if ((err = redux (&M[1 << (winsize - 1)], P, &mu)) != MP_OKAY) {
      goto LBL_MU;
    }
  }

  /* create upper table, that is M[x] = M[x-1] * M[1] (mod P)
   * for x = (2**(winsize - 1) + 1) to (2**winsize - 1)
   */
  for (x = (1 << (winsize - 1)) + 1; x < (1 << winsize); x++) {
    if ((err = mp_mul (&M[x - 1], &M[1], &M[x])) != MP_OKAY) {
      goto LBL_MU;
    }
    if ((err = redux (&M[x], P, &mu)) != MP_OKAY) {
      goto LBL_MU;
    }
  }

  /* setup result */
  if ((err = mp_init (&res)) != MP_OKAY) {
    goto LBL_MU;
  }
  mp_set (&res, 1);

  /* set initial mode and bit cnt */
  mode   = 0;
  bitcnt = 1;
  buf    = 0;
  digidx = X->used - 1;
  bitcpy = 0;
  bitbuf = 0;

  for (;;) {
    /* grab next digit as required */
    if (--bitcnt == 0) {
      /* if digidx == -1 we are out of digits */
      if (digidx == -1) {
        break;
      }
      /* read next digit and reset the bitcnt */
      buf    = X->dp[digidx--];
      bitcnt = (int) DIGIT_BIT;
    }

    /* grab the next msb from the exponent */
    y     = (buf >> (mp_digit)(DIGIT_BIT - 1)) & 1;
    buf <<= (mp_digit)1;

    /* if the bit is zero and mode == 0 then we ignore it
     * These represent the leading zero bits before the first 1 bit
     * in the exponent.  Technically this opt is not required but it
     * does lower the # of trivial squaring/reductions used
     */
    if (mode == 0 && y == 0) {
      continue;
    }

    /* if the bit is zero and mode == 1 then we square */
    if (mode == 1 && y == 0) {
      if ((err = mp_sqr (&res, &res)) != MP_OKAY) {
        goto LBL_RES;
      }
      if ((err = redux (&res, P, &mu)) != MP_OKAY) {
        goto LBL_RES;
      }
      continue;
    }

    /* else we add it to the window */
    bitbuf |= (y << (winsize - ++bitcpy));
    mode    = 2;

    if (bitcpy == winsize) {
      /* ok window is filled so square as required and multiply  */
      /* square first */
      for (x = 0; x < winsize; x++) {
        if ((err = mp_sqr (&res, &res)) != MP_OKAY) {
          goto LBL_RES;
        }
        if ((err = redux (&res, P, &mu)) != MP_OKAY) {
          goto LBL_RES;
        }
      }

      /* then multiply */
      if ((err = mp_mul (&res, &M[bitbuf], &res)) != MP_OKAY) {
        goto LBL_RES;
      }
      if ((err = redux (&res, P, &mu)) != MP_OKAY) {
        goto LBL_RES;
      }

      /* empty window and reset */
      bitcpy = 0;
      bitbuf = 0;
      mode   = 1;
    }
  }

  /* if bits remain then square/multiply */
  if (mode == 2 && bitcpy > 0) {
    /* square then multiply if the bit is set */
    for (x = 0; x < bitcpy; x++) {
      if ((err = mp_sqr (&res, &res)) != MP_OKAY) {
        goto LBL_RES;
      }
      if ((err = redux (&res, P, &mu)) != MP_OKAY) {
        goto LBL_RES;
      }

      bitbuf <<= 1;
      if ((bitbuf & (1 << winsize)) != 0) {
        /* then multiply */
        if ((err = mp_mul (&res, &M[1], &res)) != MP_OKAY) {
          goto LBL_RES;
        }
        if ((err = redux (&res, P, &mu)) != MP_OKAY) {
          goto LBL_RES;
        }
      }
    }
  }

  mp_exch (&res, Y);
  err = MP_OKAY;
LBL_RES:mp_clear (&res);
LBL_MU:mp_clear (&mu);
LBL_M:
  mp_clear(&M[1]);
  for (x = 1<<(winsize-1); x < (1 << winsize); x++) {
    mp_clear (&M[x]);
  }
  return err;
}